

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::CDictionary(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,int initialCapacity)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->keyToIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->keyToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keyToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->size = 0;
  this->capacity = 0;
  this->keyDataPairs = (CKeyDataPair *)0x0;
  (this->keyToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keyToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keyToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  grow(this,initialCapacity);
  return;
}

Assistant:

CDictionary<Data, Key>::CDictionary( int initialCapacity ):
	size( 0 ),
	capacity( 0 ),
	keyDataPairs( 0 )
{
	SetCapacity( initialCapacity );
}